

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O1

void vera::texture(Texture *_texture,string *_uniform_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Shader *pSVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string uniform_name;
  string local_90;
  string local_70;
  string local_50;
  
  if (shaderPtr == (Shader *)0x0) {
    shaderPtr = getFillShader();
  }
  pcVar2 = (_uniform_name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + _uniform_name->_M_string_length);
  if (_uniform_name->_M_string_length == 0) {
    toString<unsigned_long>(&local_50,&shaderPtr->textureIndex);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2edd27);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  pSVar3 = shaderPtr;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"USE_TEXTURE","");
  (*(pSVar3->super_HaveDefines)._vptr_HaveDefines[10])(pSVar3,&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  Shader::setUniformTexture(shaderPtr,&local_70,_texture,shaderPtr->textureIndex);
  pSVar3 = shaderPtr;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  iVar4 = (*_texture->_vptr_Texture[0xc])(_texture);
  iVar5 = (*_texture->_vptr_Texture[0xd])(_texture);
  Shader::setUniform(pSVar3,&local_90,(float)iVar4,(float)iVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  shaderPtr->textureIndex = shaderPtr->textureIndex + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void texture(Texture* _texture, const std::string _uniform_name) {
    if (shaderPtr == nullptr)
        shaderPtr = getFillShader();
    
    std::string uniform_name = _uniform_name;
    if (_uniform_name.size() == 0)
        uniform_name = "u_tex" + toString(shaderPtr->textureIndex);
    shaderPtr->addDefine("USE_TEXTURE", uniform_name);
    shaderPtr->setUniformTexture(uniform_name, _texture, shaderPtr->textureIndex );
    shaderPtr->setUniform(uniform_name + "Resolution", (float)_texture->getWidth(), (float)_texture->getHeight());
    shaderPtr->textureIndex++;
}